

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O2

olsrv2_tc_attachment * olsrv2_tc_endpoint_add(olsrv2_tc_node *node,os_route_key *prefix,_Bool mesh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long lVar8;
  olsrv2_tc_attachment *poVar9;
  olsrv2_tc_endpoint *poVar10;
  
  lVar8 = avl_find(&node->_attached_networks);
  if (lVar8 != 0) {
    return (olsrv2_tc_attachment *)(lVar8 + -0x28);
  }
  poVar9 = (olsrv2_tc_attachment *)oonf_class_malloc(&_tc_attached_class);
  if (poVar9 == (olsrv2_tc_attachment *)0x0) {
LAB_00108623:
    poVar9 = (olsrv2_tc_attachment *)0x0;
  }
  else {
    lVar8 = avl_find(&_tc_endpoint_tree,prefix);
    if (lVar8 == 0) {
      poVar10 = (olsrv2_tc_endpoint *)oonf_class_malloc(&_tc_endpoint_class);
      if (poVar10 == (olsrv2_tc_endpoint *)0x0) {
        oonf_class_free(&_tc_attached_class,poVar9);
        goto LAB_00108623;
      }
      (poVar10->target).type = OLSRV2_NETWORK_TARGET - mesh;
      avl_init(&poVar10->_attached_networks,&os_routing_avl_cmp_route_key,0);
      *(undefined4 *)((poVar10->target).prefix.src._addr + 0xe) =
           *(undefined4 *)((prefix->src)._addr + 0xe);
      uVar1 = *(undefined4 *)(prefix->dst)._addr;
      uVar2 = *(undefined4 *)((prefix->dst)._addr + 4);
      uVar3 = *(undefined4 *)((prefix->dst)._addr + 8);
      uVar4 = *(undefined4 *)((prefix->dst)._addr + 0xc);
      uVar5 = *(undefined4 *)((prefix->src)._addr + 2);
      uVar6 = *(undefined4 *)((prefix->src)._addr + 6);
      uVar7 = *(undefined4 *)((prefix->src)._addr + 10);
      *(undefined4 *)&(poVar10->target).prefix.dst._type = *(undefined4 *)&(prefix->dst)._type;
      *(undefined4 *)((poVar10->target).prefix.src._addr + 2) = uVar5;
      *(undefined4 *)((poVar10->target).prefix.src._addr + 6) = uVar6;
      *(undefined4 *)((poVar10->target).prefix.src._addr + 10) = uVar7;
      *(undefined4 *)(poVar10->target).prefix.dst._addr = uVar1;
      *(undefined4 *)((poVar10->target).prefix.dst._addr + 4) = uVar2;
      *(undefined4 *)((poVar10->target).prefix.dst._addr + 8) = uVar3;
      *(undefined4 *)((poVar10->target).prefix.dst._addr + 0xc) = uVar4;
      (poVar10->_node).key = poVar10;
      avl_insert(&_tc_endpoint_tree,&poVar10->_node);
      oonf_class_event(&_tc_endpoint_class,poVar10,1);
    }
    else {
      poVar10 = (olsrv2_tc_endpoint *)(lVar8 + -0xb0);
    }
    poVar9->src = node;
    poVar9->dst = poVar10;
    for (lVar8 = 4; lVar8 != 8; lVar8 = lVar8 + 1) {
      poVar9->cost[lVar8 + -4] = 0xffffff;
    }
    (poVar9->_src_node).key = poVar10;
    avl_insert(&node->_attached_networks,&poVar9->_src_node);
    (poVar9->_endpoint_node).key = node;
    avl_insert(&poVar10->_attached_networks,&poVar9->_endpoint_node);
    olsrv2_routing_dijkstra_node_init(&(poVar10->target)._dijkstra,(netaddr *)node);
    oonf_class_event(&_tc_attached_class,poVar9,1);
  }
  return poVar9;
}

Assistant:

struct olsrv2_tc_attachment *
olsrv2_tc_endpoint_add(struct olsrv2_tc_node *node, struct os_route_key *prefix, bool mesh) {
  struct olsrv2_tc_attachment *net;
  struct olsrv2_tc_endpoint *end;
  int i;

  net = avl_find_element(&node->_attached_networks, prefix, net, _src_node);
  if (net != NULL) {
    return net;
  }

  net = oonf_class_malloc(&_tc_attached_class);
  if (net == NULL) {
    return NULL;
  }

  end = avl_find_element(&_tc_endpoint_tree, prefix, end, _node);
  if (end == NULL) {
    /* create new endpoint */
    end = oonf_class_malloc(&_tc_endpoint_class);
    if (end == NULL) {
      oonf_class_free(&_tc_attached_class, net);
      return NULL;
    }

    /* initialize endpoint */
    end->target.type = mesh ? OLSRV2_ADDRESS_TARGET : OLSRV2_NETWORK_TARGET;
    avl_init(&end->_attached_networks, os_routing_avl_cmp_route_key, false);

    /* attach to global tree */
    memcpy(&end->target.prefix, prefix, sizeof(*prefix));
    end->_node.key = &end->target.prefix;
    avl_insert(&_tc_endpoint_tree, &end->_node);

    oonf_class_event(&_tc_endpoint_class, end, OONF_OBJECT_ADDED);
  }

  /* initialize attached network */
  net->src = node;
  net->dst = end;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    net->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook into src node */
  net->_src_node.key = &end->target.prefix;
  avl_insert(&node->_attached_networks, &net->_src_node);

  /* hook into endpoint */
  net->_endpoint_node.key = &node->target.prefix;
  avl_insert(&end->_attached_networks, &net->_endpoint_node);

  /* initialize dijkstra data */
  olsrv2_routing_dijkstra_node_init(&end->target._dijkstra, &node->target.prefix.dst);

  oonf_class_event(&_tc_attached_class, net, OONF_OBJECT_ADDED);
  return net;
}